

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h264e_vepu540c.c
# Opt level: O0

MPP_RET hal_h264e_vepu540c_ret_task(void *hal,HalEncTask *task)

{
  EncRcTask *pEVar1;
  long lVar2;
  uint uVar3;
  HalVepu540cRegSet *regs_set;
  RK_U32 mbs;
  RK_U32 mb_h;
  RK_U32 mb_w;
  EncRcTaskInfo *rc_info;
  HalH264eVepu540cCtx *ctx;
  HalEncTask *task_local;
  void *hal_local;
  
  pEVar1 = task->rc_task;
  uVar3 = *(int *)(*(long *)((long)hal + 0x38) + 0x3c) *
          *(int *)(*(long *)((long)hal + 0x38) + 0x40);
  lVar2 = *(long *)((long)hal + 0x160);
  if ((hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu540c","enter %p\n","hal_h264e_vepu540c_ret_task",hal);
  }
  task->length = task->hw_length + task->length;
  (pEVar1->info).bit_real = task->hw_length << 3;
  (pEVar1->info).quality_real = *(uint *)(lVar2 + 0x1384) / uVar3;
  (pEVar1->info).iblk4_prop =
       (((*(uint *)(lVar2 + 0x1414) & 0x7fffff) + (*(uint *)(lVar2 + 0x1410) & 0x7fffff) +
        (*(uint *)(lVar2 + 0x140c) & 0x1fffff)) * 0x100) / uVar3;
  (pEVar1->info).sse =
       (ulong)*(uint *)(lVar2 + 0x1380) * 0x10000 + (long)(int)(*(uint *)(lVar2 + 0x137c) >> 0x10);
  (pEVar1->info).lvl16_inter_num = *(uint *)(lVar2 + 0x1400) & 0x1fffff;
  (pEVar1->info).lvl8_inter_num = *(uint *)(lVar2 + 0x1404) & 0x7fffff;
  (pEVar1->info).lvl16_intra_num = *(uint *)(lVar2 + 0x140c) & 0x1fffff;
  (pEVar1->info).lvl8_intra_num = *(uint *)(lVar2 + 0x1410) & 0x7fffff;
  (pEVar1->info).lvl4_intra_num = *(uint *)(lVar2 + 0x1414) & 0x7fffff;
  *(RK_S32 *)((long)hal + 0xf0) = (pEVar1->info).bit_real;
  *(RK_S32 *)((long)hal + 0xf4) = (pEVar1->info).quality_real;
  *(RK_U32 *)((long)hal + 0x100) = (pEVar1->info).iblk4_prop;
  (task->hal_ret).data = (void *)((long)hal + 0xd0);
  (task->hal_ret).number = 1;
  if ((hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu540c","leave %p\n","hal_h264e_vepu540c_ret_task",hal);
  }
  return MPP_OK;
}

Assistant:

static MPP_RET hal_h264e_vepu540c_ret_task(void *hal, HalEncTask *task)
{
    HalH264eVepu540cCtx *ctx = (HalH264eVepu540cCtx *)hal;
    EncRcTaskInfo *rc_info = &task->rc_task->info;
    RK_U32 mb_w = ctx->sps->pic_width_in_mbs;
    RK_U32 mb_h = ctx->sps->pic_height_in_mbs;
    RK_U32 mbs = mb_w * mb_h;
    HalVepu540cRegSet *regs_set = (HalVepu540cRegSet *)ctx->regs_set;
    hal_h264e_dbg_func("enter %p\n", hal);

    // update total hardware length
    task->length += task->hw_length;

    // setup bit length for rate control
    rc_info->bit_real = task->hw_length * 8;
    rc_info->quality_real = regs_set->reg_st.qp_sum / mbs;
    /*
        rc_info->madi = (!regs_set->reg_st.st_bnum_b16.num_b16) ? 0 :
                        regs_set->reg_st.madi /  regs_set->reg_st.st_bnum_b16.num_b16;
        rc_info->madp = (!regs_set->reg_st.st_bnum_cme.num_ctu) ? 0 :
                        regs_set->reg_st.madi / regs_set->reg_st.st_bnum_cme.num_ctu;*/

    rc_info->iblk4_prop = (regs_set->reg_st.st_pnum_i4.pnum_i4 +
                           regs_set->reg_st.st_pnum_i8.pnum_i8 +
                           regs_set->reg_st.st_pnum_i16.pnum_i16) * 256 / mbs;

    rc_info->sse = ((RK_S64)regs_set->reg_st.sse_h32 << 16) +
                   (regs_set->reg_st.st_sse_bsl.sse_l16 & 0xffff);
    rc_info->lvl16_inter_num = regs_set->reg_st.st_pnum_p16.pnum_p16;
    rc_info->lvl8_inter_num  = regs_set->reg_st.st_pnum_p8.pnum_p8;
    rc_info->lvl16_intra_num = regs_set->reg_st.st_pnum_i16.pnum_i16;
    rc_info->lvl8_intra_num  = regs_set->reg_st.st_pnum_i8.pnum_i8;
    rc_info->lvl4_intra_num  = regs_set->reg_st.st_pnum_i4.pnum_i4;

    ctx->hal_rc_cfg.bit_real = rc_info->bit_real;
    ctx->hal_rc_cfg.quality_real = rc_info->quality_real;
    ctx->hal_rc_cfg.iblk4_prop = rc_info->iblk4_prop;

    task->hal_ret.data   = &ctx->hal_rc_cfg;
    task->hal_ret.number = 1;

    hal_h264e_dbg_func("leave %p\n", hal);

    return MPP_OK;
}